

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesBufferTests.cpp
# Opt level: O3

void __thiscall
vkt::sparse::anon_unknown_0::DrawGridTestInstance::DrawGridTestInstance
          (DrawGridTestInstance *this,Context *context,TestFlags flags,VkBufferUsageFlags usage,
          VkDeviceSize minChunkSize)

{
  Move<vk::Handle<(vk::HandleType)8>_> *pMVar1;
  MovePtr<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
  *this_00;
  Move<vk::Handle<(vk::HandleType)8>_> *pMVar2;
  DeviceDriver *this_01;
  VkBuffer VVar3;
  SparseAllocation *pSVar4;
  VkDevice pVVar5;
  Allocation *pAVar6;
  VkDeviceSize bufferSize;
  VkBufferCreateInfo referenceCreateInfo;
  Handle<(vk::HandleType)8> HVar7;
  DeviceInterface *pDVar8;
  VkAllocationCallbacks *pVVar9;
  undefined8 uVar10;
  ulong uVar11;
  deUint32 numChunks;
  bool bVar12;
  SparseAllocationBuilder builder;
  VkBufferCreateInfo referenceBufferCreateInfo;
  Move<vk::Handle<(vk::HandleType)8>_> local_e8;
  undefined1 local_c8 [16];
  vector<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>
  local_b8;
  pointer local_a0;
  pointer local_90;
  Move<vk::Handle<(vk::HandleType)8>_> local_88;
  VkBufferCreateInfo local_68;
  
  SparseBufferTestInstance::SparseBufferTestInstance
            (&this->super_SparseBufferTestInstance,context,flags);
  numChunks = (deUint32)context;
  (this->super_SparseBufferTestInstance).super_SparseResourcesBaseInstance.super_TestInstance.
  _vptr_TestInstance = (_func_int **)&PTR__DrawGridTestInstance_00cfeda8;
  (this->super_SparseBufferTestInstance).super_Delegate._vptr_Delegate =
       (_func_int **)&PTR__DrawGridTestInstance_00cfedd8;
  (this->m_sparseAllocation).
  super_UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
  .m_data.ptr = (SparseAllocation *)0x0;
  (this->m_sparseBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
  (this->m_sparseBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface
       = (DeviceInterface *)0x0;
  (this->m_sparseBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_sparseBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_stagingBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0
  ;
  (this->m_stagingBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface
       = (DeviceInterface *)0x0;
  (this->m_stagingBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_stagingBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_stagingBufferAlloc).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
  .m_data.ptr = (Allocation *)0x0;
  this_01 = (this->super_SparseBufferTestInstance).super_SparseResourcesBaseInstance.m_deviceDriver.
            super_UniqueBase<vk::DeviceDriver,_de::DefaultDeleter<vk::DeviceDriver>_>.m_data.ptr;
  local_68.flags =
       (uint)(this->super_SparseBufferTestInstance).m_residency * 2 +
       (uint)(this->super_SparseBufferTestInstance).m_aliased * 4 + 1;
  local_68.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  local_68.pNext = (void *)0x0;
  local_68.size = 0;
  local_68.usage = usage | 2;
  local_68.queueFamilyIndexCount = 0;
  local_68.pQueueFamilyIndices = (deUint32 *)0x0;
  bVar12 = (this->super_SparseBufferTestInstance).m_sparseQueue.queueFamilyIndex !=
           (this->super_SparseBufferTestInstance).m_universalQueue.queueFamilyIndex;
  if (bVar12) {
    local_68.queueFamilyIndexCount = 2;
    local_68.pQueueFamilyIndices = (this->super_SparseBufferTestInstance).m_sharedQueueFamilyIndices
    ;
  }
  local_68.sharingMode = (VkSharingMode)bVar12;
  pMVar1 = &this->m_stagingBuffer;
  this_00 = &this->m_sparseAllocation;
  pMVar2 = &this->m_sparseBuffer;
  SparseAllocationBuilder::SparseAllocationBuilder((SparseAllocationBuilder *)local_c8);
  SparseAllocationBuilder::addMemoryBind((SparseAllocationBuilder *)local_c8,numChunks);
  if ((this->super_SparseBufferTestInstance).m_residency == true) {
    local_c8._4_4_ = local_c8._4_4_ + 1;
  }
  SparseAllocationBuilder::addMemoryAllocation((SparseAllocationBuilder *)local_c8);
  local_c8._8_4_ = local_c8._8_4_ + 1;
  local_a0[local_c8._0_8_ & 0xffffffff] = local_a0[local_c8._0_8_ & 0xffffffff] + 1;
  SparseAllocationBuilder::addMemoryBind((SparseAllocationBuilder *)local_c8,numChunks);
  if ((this->super_SparseBufferTestInstance).m_aliased == true) {
    local_e8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal =
         local_c8._0_8_ & 0xffffffff00000000;
    local_e8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x100000000;
    std::
    vector<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>
    ::push_back(&local_b8,(value_type *)&local_e8);
    local_c8._4_4_ = local_c8._4_4_ + 1;
  }
  referenceCreateInfo._4_4_ = local_68._4_4_;
  referenceCreateInfo.sType = local_68.sType;
  referenceCreateInfo._20_4_ = local_68._20_4_;
  referenceCreateInfo.flags = local_68.flags;
  referenceCreateInfo.sharingMode = local_68.sharingMode;
  referenceCreateInfo.usage = local_68.usage;
  referenceCreateInfo._44_4_ = local_68._44_4_;
  referenceCreateInfo.queueFamilyIndexCount = local_68.queueFamilyIndexCount;
  referenceCreateInfo.pNext = local_68.pNext;
  referenceCreateInfo.size = local_68.size;
  referenceCreateInfo.pQueueFamilyIndices = local_68.pQueueFamilyIndices;
  SparseAllocationBuilder::build
            ((MovePtr<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
              *)&local_e8,(SparseAllocationBuilder *)local_c8,&this_01->super_DeviceInterface,
             (this->super_SparseBufferTestInstance).super_SparseResourcesBaseInstance.
             m_logicalDevice.super_RefBase<vk::VkDevice_s_*>.m_data.object,
             (this->super_SparseBufferTestInstance).super_SparseResourcesBaseInstance.m_allocator.
             super_UniqueBase<vk::Allocator,_de::DefaultDeleter<vk::Allocator>_>.m_data.ptr,
             referenceCreateInfo,minChunkSize);
  HVar7.m_internal = local_e8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
  ;
  local_e8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
  if ((this_00->
      super_UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
      ).m_data.ptr != (SparseAllocation *)HVar7.m_internal) {
    de::details::
    UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
    ::reset(&this_00->
             super_UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
           );
    (this_00->
    super_UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
    ).m_data.ptr = (SparseAllocation *)HVar7.m_internal;
  }
  de::details::
  UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
  ::reset((UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
           *)&local_e8);
  if (local_a0 != (pointer)0x0) {
    operator_delete(local_a0,(long)local_90 - (long)local_a0);
  }
  if (local_b8.
      super__Vector_base<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.
                    super__Vector_base<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_b8.
                          super__Vector_base<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.
                          super__Vector_base<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_68.size =
       ((this->m_sparseAllocation).
        super_UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
        .m_data.ptr)->resourceSize;
  ::vk::createBuffer(&local_e8,&this_01->super_DeviceInterface,
                     (this->super_SparseBufferTestInstance).super_SparseResourcesBaseInstance.
                     m_logicalDevice.super_RefBase<vk::VkDevice_s_*>.m_data.object,&local_68,
                     (VkAllocationCallbacks *)0x0);
  pVVar9 = local_e8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator;
  pVVar5 = local_e8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device;
  pDVar8 = local_e8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface;
  HVar7.m_internal = local_e8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
  ;
  local_b8.
  super__Vector_base<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)local_e8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device;
  local_b8.
  super__Vector_base<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)local_e8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator;
  local_c8._0_8_ = local_e8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  local_c8._8_8_ =
       local_e8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface;
  local_e8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
  local_e8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_e8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_e8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  VVar3.m_internal =
       (pMVar2->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.object.m_internal;
  if (VVar3.m_internal == 0) {
    (this->m_sparseBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
         pVVar5;
    (this->m_sparseBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator
         = pVVar9;
    (pMVar2->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.object.m_internal =
         HVar7.m_internal;
    (this->m_sparseBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
    m_deviceIface = pDVar8;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&(this->m_sparseBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               VVar3);
    (this->m_sparseBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
         (VkDevice)
         local_b8.
         super__Vector_base<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (this->m_sparseBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator
         = (VkAllocationCallbacks *)
           local_b8.
           super__Vector_base<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>
           ._M_impl.super__Vector_impl_data._M_finish;
    (pMVar2->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.object.m_internal =
         local_c8._0_8_;
    (this->m_sparseBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
    m_deviceIface = (DeviceInterface *)local_c8._8_8_;
    if (local_e8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
                (&local_e8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
                 (VkBuffer)
                 local_e8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal);
    }
  }
  pSVar4 = (this->m_sparseAllocation).
           super_UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
           .m_data.ptr;
  bindSparseBuffer((anon_unknown_0 *)this_01,
                   (DeviceInterface *)
                   (this->super_SparseBufferTestInstance).super_SparseResourcesBaseInstance.
                   m_logicalDevice.super_RefBase<vk::VkDevice_s_*>.m_data.object,
                   (VkDevice)(this->super_SparseBufferTestInstance).m_sparseQueue.queueHandle,
                   (VkQueue)(this->m_sparseBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.
                            m_data.object.m_internal,
                   (VkBuffer)
                   (pSVar4->memoryBinds).
                   super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   (SparseAllocation *)
                   (pSVar4->memoryBinds).
                   super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
  pSVar4 = (this->m_sparseAllocation).
           super_UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
           .m_data.ptr;
  uVar11 = pSVar4->resourceSize / (ulong)pSVar4->numResourceChunks;
  this->m_perDrawBufferOffset = uVar11;
  bufferSize = uVar11 * 2;
  this->m_stagingBufferSize = bufferSize;
  pVVar5 = (this->super_SparseBufferTestInstance).super_SparseResourcesBaseInstance.m_logicalDevice.
           super_RefBase<vk::VkDevice_s_*>.m_data.object;
  makeBufferCreateInfo((VkBufferCreateInfo *)local_c8,bufferSize,1);
  ::vk::createBuffer(&local_88,&this_01->super_DeviceInterface,pVVar5,(VkBufferCreateInfo *)local_c8
                     ,(VkAllocationCallbacks *)0x0);
  pVVar9 = local_88.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator;
  pVVar5 = local_88.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device;
  pDVar8 = local_88.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface;
  HVar7.m_internal = local_88.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
  ;
  local_e8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       local_88.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device;
  local_e8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       local_88.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator;
  local_e8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal =
       local_88.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  local_e8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       local_88.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface;
  local_88.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
  local_88.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_88.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_88.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  VVar3.m_internal =
       (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.object.m_internal;
  if (VVar3.m_internal == 0) {
    (this->m_stagingBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
         pVVar5;
    (this->m_stagingBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator
         = pVVar9;
    (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.object.m_internal =
         HVar7.m_internal;
    (this->m_stagingBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
    m_deviceIface = pDVar8;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&(this->m_stagingBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter
               ,VVar3);
    (this->m_stagingBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
         local_e8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device;
    (this->m_stagingBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator
         = local_e8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator;
    (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.object.m_internal =
         local_e8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
    (this->m_stagingBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
    m_deviceIface =
         local_e8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface;
    if (local_88.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
                (&local_88.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
                 (VkBuffer)
                 local_88.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal);
    }
  }
  bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_c8,
             &this_01->super_DeviceInterface,
             (this->super_SparseBufferTestInstance).super_SparseResourcesBaseInstance.
             m_logicalDevice.super_RefBase<vk::VkDevice_s_*>.m_data.object,
             (this->super_SparseBufferTestInstance).super_SparseResourcesBaseInstance.m_allocator.
             super_UniqueBase<vk::Allocator,_de::DefaultDeleter<vk::Allocator>_>.m_data.ptr,
             (VkBuffer)
             (this->m_stagingBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal,(MemoryRequirement)0x1);
  uVar10 = local_c8._0_8_;
  local_c8._0_8_ = (Allocation *)0x0;
  pAVar6 = (this->m_stagingBufferAlloc).
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  if (pAVar6 != (Allocation *)uVar10) {
    if (pAVar6 == (Allocation *)0x0) {
      (this->m_stagingBufferAlloc).
      super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
           (Allocation *)uVar10;
    }
    else {
      (*pAVar6->_vptr_Allocation[1])();
      (this->m_stagingBufferAlloc).
      super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
           (Allocation *)uVar10;
      if ((Allocation *)local_c8._0_8_ != (Allocation *)0x0) {
        (*(*(_func_int ***)local_c8._0_8_)[1])();
      }
    }
  }
  return;
}

Assistant:

DrawGridTestInstance (Context& context, const TestFlags flags, const VkBufferUsageFlags usage, const VkDeviceSize minChunkSize)
		: SparseBufferTestInstance	(context, flags)
	{
		const DeviceInterface&	vk							= getDeviceInterface();
		VkBufferCreateInfo		referenceBufferCreateInfo	= getSparseBufferCreateInfo(usage);

		{
			// Allocate two chunks, each covering half of the viewport
			SparseAllocationBuilder builder;
			builder.addMemoryBind();

			if (m_residency)
				builder.addResourceHole();

			builder
				.addMemoryAllocation()
				.addMemoryHole()
				.addMemoryBind();

			if (m_aliased)
				builder.addAliasedMemoryBind(0u, 0u);

			m_sparseAllocation	= builder.build(vk, getDevice(), getAllocator(), referenceBufferCreateInfo, minChunkSize);
		}

		// Create the buffer
		referenceBufferCreateInfo.size	= m_sparseAllocation->resourceSize;
		m_sparseBuffer					= makeBuffer(vk, getDevice(), referenceBufferCreateInfo);

		// Bind the memory
		bindSparseBuffer(vk, getDevice(), m_sparseQueue.queueHandle, *m_sparseBuffer, *m_sparseAllocation);

		m_perDrawBufferOffset	= m_sparseAllocation->resourceSize / m_sparseAllocation->numResourceChunks;
		m_stagingBufferSize		= 2 * m_perDrawBufferOffset;
		m_stagingBuffer			= makeBuffer(vk, getDevice(), makeBufferCreateInfo(m_stagingBufferSize, VK_BUFFER_USAGE_TRANSFER_SRC_BIT));
		m_stagingBufferAlloc	= bindBuffer(vk, getDevice(), getAllocator(), *m_stagingBuffer, MemoryRequirement::HostVisible);
	}